

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprPhraseFree(Fts5ExprPhrase *pPhrase)

{
  Fts5ExprTerm *pFVar1;
  long lVar2;
  Fts5ExprTerm *pTerm;
  Fts5ExprTerm *pNext;
  Fts5ExprTerm *pSyn;
  int i;
  Fts5ExprPhrase *pPhrase_local;
  
  if (pPhrase != (Fts5ExprPhrase *)0x0) {
    for (pSyn._4_4_ = 0; pSyn._4_4_ < pPhrase->nTerm; pSyn._4_4_ = pSyn._4_4_ + 1) {
      lVar2 = (long)pSyn._4_4_;
      sqlite3_free(pPhrase->aTerm[lVar2].zTerm);
      sqlite3Fts5IterClose(pPhrase->aTerm[lVar2].pIter);
      pNext = pPhrase->aTerm[lVar2].pSynonym;
      while (pNext != (Fts5ExprTerm *)0x0) {
        pFVar1 = pNext->pSynonym;
        sqlite3Fts5IterClose(pNext->pIter);
        sqlite3Fts5BufferFree((Fts5Buffer *)(pNext + 1));
        sqlite3_free(pNext);
        pNext = pFVar1;
      }
    }
    if (0 < (pPhrase->poslist).nSpace) {
      sqlite3Fts5BufferFree(&pPhrase->poslist);
    }
    sqlite3_free(pPhrase);
  }
  return;
}

Assistant:

static void fts5ExprPhraseFree(Fts5ExprPhrase *pPhrase){
  if( pPhrase ){
    int i;
    for(i=0; i<pPhrase->nTerm; i++){
      Fts5ExprTerm *pSyn;
      Fts5ExprTerm *pNext;
      Fts5ExprTerm *pTerm = &pPhrase->aTerm[i];
      sqlite3_free(pTerm->zTerm);
      sqlite3Fts5IterClose(pTerm->pIter);
      for(pSyn=pTerm->pSynonym; pSyn; pSyn=pNext){
        pNext = pSyn->pSynonym;
        sqlite3Fts5IterClose(pSyn->pIter);
        fts5BufferFree((Fts5Buffer*)&pSyn[1]);
        sqlite3_free(pSyn);
      }
    }
    if( pPhrase->poslist.nSpace>0 ) fts5BufferFree(&pPhrase->poslist);
    sqlite3_free(pPhrase);
  }
}